

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O3

void G_DoNewGame(void)

{
  UCVarValue value;
  
  G_NewInit();
  playeringame[consoleplayer] = true;
  value._4_4_ = 0;
  value.Int = d_skill;
  if (value.String != (char *)0xffffffff) {
    FBaseCVar::SetGenericRep(&gameskill.super_FBaseCVar,value,CVAR_Int);
  }
  G_InitNew(d_mapname.Chars,false);
  gameaction = ga_nothing;
  return;
}

Assistant:

void G_DoNewGame (void)
{
	G_NewInit ();
	playeringame[consoleplayer] = 1;
	if (d_skill != -1)
	{
		gameskill = d_skill;
	}
	G_InitNew (d_mapname, false);
	gameaction = ga_nothing;
}